

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  int n;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  if (count != 0) {
    uVar1 = (ulong)(uint)count;
    if (count == 1) {
      if (0.0 <= items->Width) {
        fVar5 = items->Width - width_excess;
        if (fVar5 <= 1.0) {
          fVar5 = 1.0;
        }
        items->Width = fVar5;
      }
    }
    else {
      qsort(items,(long)count,8,ShrinkWidthItemComparer);
      if ((1 < count) && (0.0 < width_excess)) {
        uVar3 = 1;
        do {
          fVar5 = items->Width;
          uVar3 = (ulong)(int)uVar3;
          do {
            fVar6 = items[uVar3].Width;
            if (fVar6 < fVar5) {
              if (0.0 <= fVar6) {
                fVar5 = fVar5 - fVar6;
                goto LAB_0015bdf7;
              }
              break;
            }
            uVar3 = uVar3 + 1;
          } while ((long)uVar3 < (long)uVar1);
          fVar5 = fVar5 + -1.0;
LAB_0015bdf7:
          if (fVar5 <= 0.0) break;
          iVar2 = (int)uVar3;
          fVar6 = width_excess / (float)iVar2;
          if (fVar5 <= fVar6) {
            fVar6 = fVar5;
          }
          if (0 < iVar2) {
            uVar4 = 0;
            do {
              items[uVar4].Width = items[uVar4].Width - fVar6;
              uVar4 = uVar4 + 1;
            } while ((uVar3 & 0xffffffff) != uVar4);
          }
          if ((count <= iVar2) ||
             (width_excess = width_excess - fVar6 * (float)iVar2, width_excess <= 0.0)) break;
        } while( true );
      }
      if (0 < count) {
        fVar5 = 0.0;
        uVar3 = 0;
        do {
          fVar6 = (float)(int)items[uVar3].Width;
          fVar5 = fVar5 + (items[uVar3].Width - fVar6);
          items[uVar3].Width = fVar6;
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
        if (0.0 < fVar5 && 0 < count) {
          uVar3 = 0;
          do {
            if (items[uVar3].Index < (int)(fVar5 + 0.01)) {
              items[uVar3].Width = items[uVar3].Width + 1.0;
            }
            uVar3 = uVar3 + 1;
          } while (uVar1 != uVar3);
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        if (items[0].Width >= 0.0f)
            items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count && items[count_same_width].Width >= 0.0f) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        if (max_width_to_remove_per_item <= 0.0f)
            break;
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder left-to-right (could make it an option of the function?)
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    if (width_excess > 0.0f)
        for (int n = 0; n < count; n++)
            if (items[n].Index < (int)(width_excess + 0.01f))
                items[n].Width += 1.0f;
}